

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sanity.cpp
# Opt level: O3

void __thiscall cubeb_drain_Test::TestBody(cubeb_drain_Test *this)

{
  bool bVar1;
  stringstream *psVar2;
  int iVar3;
  anon_enum_32 *in_RCX;
  anon_enum_32 *actual;
  cubeb_stream **val1;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar4;
  AssertHelper *this_01;
  AssertionResult gtest_ar_2;
  __atomic_base<unsigned_long> local_90 [2];
  int local_7c;
  cubeb_stream *stream;
  AssertHelper local_70;
  uint64_t position;
  cubeb *ctx;
  AssertionResult gtest_ar;
  AssertHelper local_38;
  
  delay_callback = 0;
  LOCK();
  total_frames_written.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  UNLOCK();
  local_7c = common_init(&ctx,"test_sanity");
  gtest_ar_2._0_8_ = (ulong)(uint)gtest_ar_2._4_4_ << 0x20;
  testing::internal::EqHelper<false>::Compare<int,__0>
            (&gtest_ar.success_,(char *)&local_7c,(int *)&gtest_ar_2,in_RCX);
  if (gtest_ar.success_ == false) {
    psVar2 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar2);
    *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    iVar3 = 0x256;
    gtest_ar_2._0_8_ = psVar2;
LAB_0010bfa0:
    this_00 = &gtest_ar.message_;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
               ,iVar3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if (gtest_ar_2._0_8_ == 0) goto LAB_0010c138;
    bVar1 = testing::internal::IsTrue(true);
    local_70.data_ = (AssertHelperData *)gtest_ar_2._0_8_;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar_2.success_ = false;
    gtest_ar_2._1_7_ = 0;
    testing::internal::CmpHelperNE<cubeb*,decltype(nullptr)>
              ((internal *)&gtest_ar,"ctx","nullptr",&ctx,(void **)&gtest_ar_2);
    if (gtest_ar.success_ == false) {
      psVar2 = (stringstream *)operator_new(0x188);
      std::__cxx11::stringstream::stringstream(psVar2);
      *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      iVar3 = 599;
      gtest_ar_2._0_8_ = psVar2;
      goto LAB_0010bfa0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.success_ = false;
    gtest_ar._1_7_ = 0xac44000000;
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x400000001;
    actual = (anon_enum_32 *)0x0;
    local_7c = cubeb_stream_init(ctx,&stream,"test",(cubeb_devid)0x0,(cubeb_stream_params *)0x0,
                                 (cubeb_devid)0x0,(cubeb_stream_params *)&gtest_ar,0x113a,
                                 test_drain_data_callback,test_drain_state_callback,&dummy);
    local_90[0]._M_i = (ulong)local_90[0]._M_i._4_4_ << 0x20;
    testing::internal::EqHelper<false>::Compare<int,__0>
              (&gtest_ar_2.success_,(char *)&local_7c,(int *)local_90,actual);
    if (gtest_ar_2.success_ == false) {
      psVar2 = (stringstream *)operator_new(0x188);
      std::__cxx11::stringstream::stringstream(psVar2);
      *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
      if (gtest_ar_2.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
      }
      this_01 = (AssertHelper *)&position;
      iVar3 = 0x261;
      local_90[0]._M_i = (__int_type)psVar2;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_2.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_90[0]._M_i = 0;
      val1 = &stream;
      testing::internal::CmpHelperNE<cubeb_stream*,decltype(nullptr)>
                ((internal *)&gtest_ar_2,"stream","nullptr",val1,(void **)local_90);
      if (gtest_ar_2.success_ == false) {
        psVar2 = (stringstream *)operator_new(0x188);
        std::__cxx11::stringstream::stringstream(psVar2);
        *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
        if (gtest_ar_2.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
        }
        this_01 = (AssertHelper *)&position;
        iVar3 = 0x262;
        local_90[0]._M_i = (__int_type)psVar2;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&gtest_ar_2.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_7c = cubeb_stream_start(stream);
        local_90[0]._M_i = local_90[0]._M_i & 0xffffffff00000000;
        testing::internal::EqHelper<false>::Compare<int,__0>
                  (&gtest_ar_2.success_,(char *)&local_7c,(int *)local_90,(anon_enum_32 *)val1);
        if (gtest_ar_2.success_ == false) {
          psVar2 = (stringstream *)operator_new(0x188);
          std::__cxx11::stringstream::stringstream(psVar2);
          *(undefined8 *)(psVar2 + *(long *)(*(long *)(psVar2 + 0x10) + -0x18) + 0x18) = 0x11;
          if (gtest_ar_2.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
          }
          this_01 = (AssertHelper *)&position;
          iVar3 = 0x265;
          local_90[0]._M_i = (__int_type)psVar2;
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&gtest_ar_2.message_,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          sleep(5);
          usleep(0);
          LOCK();
          do_drain.super___atomic_base<int>._M_i = (__atomic_base<int>)1;
          UNLOCK();
          local_7c = cubeb_stream_get_position(stream,&position);
          local_90[0]._M_i = local_90[0]._M_i & 0xffffffff00000000;
          testing::internal::EqHelper<false>::Compare<int,__0>
                    (&gtest_ar_2.success_,(char *)&local_7c,(int *)local_90,(anon_enum_32 *)val1);
          if (gtest_ar_2.success_ == true) {
            do {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset(&gtest_ar_2.message_,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              if (got_drain.super___atomic_base<int>._M_i != 0) {
                local_7c = cubeb_stream_get_position(stream,&position);
                local_90[0]._M_i = local_90[0]._M_i & 0xffffffff00000000;
                testing::internal::EqHelper<false>::Compare<int,__0>
                          (&gtest_ar_2.success_,(char *)&local_7c,(int *)local_90,
                           (anon_enum_32 *)val1);
                if (gtest_ar_2.success_ == false) {
                  testing::Message::Message((Message *)local_90);
                  if (gtest_ar_2.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar4 = "";
                  }
                  else {
                    pcVar4 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  this_01 = &local_70;
                  iVar3 = 0x277;
                  goto LAB_0010c0f4;
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset(&gtest_ar_2.message_,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                gtest_ar_2.success_ = got_drain.super___atomic_base<int>._M_i != 0;
                this_00 = &gtest_ar_2.message_;
                gtest_ar_2.message_.ptr_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (got_drain.super___atomic_base<int>._M_i != 0) {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0);
                  cubeb_stream_destroy(stream);
                  cubeb_destroy(ctx);
                  LOCK();
                  UNLOCK();
                  LOCK();
                  UNLOCK();
                  got_drain = (atomic<int>)0x0;
                  do_drain = (atomic<int>)0x0;
                  return;
                }
                testing::Message::Message((Message *)&local_70);
                testing::internal::GetBoolAssertionFailureMessage
                          ((internal *)local_90,&gtest_ar_2,"got_drain","false","true");
                testing::internal::AssertHelper::AssertHelper
                          (&local_38,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                           ,0x278,(char *)local_90[0]._M_i);
                testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_70);
                testing::internal::AssertHelper::~AssertHelper(&local_38);
                if ((stringstream *)local_90[0]._M_i != (stringstream *)0x0) {
                  operator_delete__((void *)local_90[0]._M_i);
                }
                if (local_70.data_ == (AssertHelperData *)0x0) goto LAB_0010c138;
                bVar1 = testing::internal::IsTrue(true);
                goto joined_r0x0010bfd3;
              }
              local_90[0] = total_frames_written.super___atomic_base<unsigned_long>._M_i;
              val1 = (cubeb_stream **)&position;
              testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                        ((internal *)&gtest_ar_2,"position","total_frames_written.load()",&position,
                         &local_90[0]._M_i);
              if (gtest_ar_2.success_ == false) {
                testing::Message::Message((Message *)local_90);
                if (gtest_ar_2.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar4 = "";
                }
                else {
                  pcVar4 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_70,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                           ,0x271,pcVar4);
                testing::internal::AssertHelper::operator=(&local_70,(Message *)local_90);
                testing::internal::AssertHelper::~AssertHelper(&local_70);
                if ((((stringstream *)local_90[0]._M_i != (stringstream *)0x0) &&
                    (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
                   ((stringstream *)local_90[0]._M_i != (stringstream *)0x0)) {
                  (**(code **)(*(long *)local_90[0]._M_i + 8))();
                }
                this_00 = &gtest_ar_2.message_;
                goto LAB_0010c138;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset(&gtest_ar_2.message_,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              sleep(0);
              usleep(500000);
              local_7c = cubeb_stream_get_position(stream,&position);
              local_90[0]._M_i = local_90[0]._M_i & 0xffffffff00000000;
              testing::internal::EqHelper<false>::Compare<int,__0>
                        (&gtest_ar_2.success_,(char *)&local_7c,(int *)local_90,(anon_enum_32 *)val1
                        );
            } while (gtest_ar_2.success_ != false);
          }
          testing::Message::Message((Message *)local_90);
          if (gtest_ar_2.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
          }
          this_01 = &local_70;
          iVar3 = 0x26d;
        }
      }
    }
LAB_0010c0f4:
    this_00 = &gtest_ar_2.message_;
    testing::internal::AssertHelper::AssertHelper
              (this_01,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
               ,iVar3,pcVar4);
    testing::internal::AssertHelper::operator=(this_01,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper(this_01);
    if ((stringstream *)local_90[0]._M_i == (stringstream *)0x0) goto LAB_0010c138;
    bVar1 = testing::internal::IsTrue(true);
    local_70.data_ = (AssertHelperData *)local_90[0]._M_i;
  }
joined_r0x0010bfd3:
  if ((bVar1) && (local_70.data_ != (AssertHelperData *)0x0)) {
    (**(code **)(*(long *)local_70.data_ + 8))();
  }
LAB_0010c138:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(cubeb, drain)
{
  int r;
  cubeb * ctx;
  cubeb_stream * stream;
  cubeb_stream_params params;
  uint64_t position;

  delay_callback = 0;
  total_frames_written = 0;

  r = common_init(&ctx, "test_sanity");
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(ctx, nullptr);

  params.format = STREAM_FORMAT;
  params.rate = STREAM_RATE;
  params.channels = STREAM_CHANNELS;
  params.layout = STREAM_LAYOUT;
  params.prefs = CUBEB_STREAM_PREF_NONE;

  r = cubeb_stream_init(ctx, &stream, "test", NULL, NULL, NULL, &params, STREAM_LATENCY,
                        test_drain_data_callback, test_drain_state_callback, &dummy);
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(stream, nullptr);

  r = cubeb_stream_start(stream);
  ASSERT_EQ(r, CUBEB_OK);

  delay(5000);

  do_drain = 1;

  for (;;) {
    r = cubeb_stream_get_position(stream, &position);
    ASSERT_EQ(r, CUBEB_OK);
    if (got_drain) {
      break;
    } else {
      ASSERT_LE(position, total_frames_written.load());
    }
    delay(500);
  }

  r = cubeb_stream_get_position(stream, &position);
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_TRUE(got_drain);

  // Really, we should be able to rely on position reaching our final written frame, but
  // for now let's make sure it doesn't continue beyond that point.
  //ASSERT_LE(position, total_frames_written.load());

  cubeb_stream_destroy(stream);
  cubeb_destroy(ctx);

  got_drain = 0;
  do_drain = 0;
}